

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AutoLink(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,NodeRange nr)

{
  pointer pNVar1;
  NodeRange NVar2;
  value_type local_18;
  
  local_18.ir_ = nr.ir_;
  local_18.pvn_ = nr.pvn_;
  if (((this->auto_link_src_item_).pvn_ != (ValueNode *)0x0) &&
     ((this->auto_link_src_item_).ir_.beg_ < (this->auto_link_src_item_).ir_.end_)) {
    pNVar1 = (this->auto_link_targ_items_).
             super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((this->auto_link_targ_items_).
         super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
         super__Vector_impl_data._M_start == pNVar1) ||
       ((pNVar1[-1].pvn_ != local_18.pvn_ || (pNVar1[-1].ir_.end_ != nr.ir_.beg_)))) {
      std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::push_back
                (&this->auto_link_targ_items_,&local_18);
    }
    else {
      pNVar1[-1].ir_.end_ = nr.ir_.end_;
    }
  }
  NVar2.ir_ = local_18.ir_;
  NVar2.pvn_ = local_18.pvn_;
  return NVar2;
}

Assistant:

pre::NodeRange AutoLink(pre::NodeRange nr) {
    if (DoingAutoLinking()) {
      if (auto_link_targ_items_.empty() ||
          !auto_link_targ_items_.back().TryExtendBy(nr))
        auto_link_targ_items_.push_back(nr);
    }
    return nr;
  }